

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int lua_getinfo(lua_State *L,char *what,lua_Debug *ar)

{
  byte bVar1;
  GCObject *pGVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  StkId pTVar7;
  GCObject *t;
  TValue *pTVar8;
  byte *pbVar9;
  GCObject *pGVar10;
  char *source;
  CallInfo *ci;
  long lVar11;
  
  if (*what == '>') {
    what = what + 1;
    pGVar10 = L->top[-1].value.gc;
    L->top = L->top + -1;
    ci = (CallInfo *)0x0;
LAB_0010abc6:
    if (pGVar10 != (GCObject *)0x0) {
      pbVar9 = (byte *)what;
      do {
        bVar1 = *pbVar9;
        if (bVar1 < 0x6e) {
          if (bVar1 == 0x53) {
            if ((pGVar10->h).flags == '\0') {
              source = (char *)&(((pGVar10->th).l_G)->grayagain->h).array;
              ar->source = source;
              iVar4 = (int)(((pGVar10->th).l_G)->buff).n;
              ar->linedefined = iVar4;
              iVar5 = *(int *)((long)&(((pGVar10->th).l_G)->buff).n + 4);
              pcVar6 = "Lua";
              if (iVar4 == 0) {
                pcVar6 = "main";
              }
            }
            else {
              ar->source = "=[C]";
              ar->linedefined = -1;
              iVar5 = -1;
              source = "=[C]";
              pcVar6 = "C";
            }
            ar->lastlinedefined = iVar5;
            ar->what = pcVar6;
            luaO_chunkid(ar->short_src,source,0x3c);
          }
          else if (bVar1 == 0x6c) {
            if (ci == (CallInfo *)0x0) {
              iVar4 = -1;
            }
            else {
              iVar4 = currentline(L,ci);
            }
            ar->currentline = iVar4;
          }
          else if (bVar1 == 0) goto LAB_0010accb;
        }
        else if (bVar1 == 0x6e) {
          ar->namewhat = "";
          ar->name = (char *)0x0;
        }
        else if (bVar1 == 0x75) {
          ar->nups = (uint)(pGVar10->h).lsizenode;
        }
        pbVar9 = pbVar9 + 1;
      } while( true );
    }
  }
  else if ((long)ar->i_ci != 0) {
    ci = L->base_ci + ar->i_ci;
    pGVar10 = (ci->func->value).gc;
    goto LAB_0010abc6;
  }
  ar->namewhat = "";
  ar->name = "";
  ar->what = "tail";
  ar->currentline = -1;
  ar->linedefined = -1;
  ar->lastlinedefined = -1;
  ar->source = "=(tail call)";
  luaO_chunkid(ar->short_src,"=(tail call)",0x3c);
  ar->nups = 0;
  pcVar6 = strchr(what,0x66);
  if (pcVar6 != (char *)0x0) {
    pTVar7 = L->top;
    pTVar7->tt = 0;
    bVar3 = true;
    pGVar10 = (GCObject *)0x0;
    goto LAB_0010ad6d;
  }
  bVar3 = true;
  pGVar10 = (GCObject *)0x0;
LAB_0010adb8:
  pTVar7 = (StkId)strchr(what,0x4c);
  if (pTVar7 == (StkId)0x0) goto LAB_0010ae73;
  if (!bVar3) goto LAB_0010add2;
LAB_0010add8:
  pTVar7 = L->top;
  pTVar7->tt = 0;
  goto LAB_0010ae43;
LAB_0010accb:
  pcVar6 = strchr(what,0x66);
  if (pcVar6 != (char *)0x0) {
    pTVar7 = L->top;
    (pTVar7->value).gc = pGVar10;
    pTVar7->tt = 6;
    pTVar7 = L->top;
    bVar3 = false;
LAB_0010ad6d:
    if ((long)L->stack_last - (long)pTVar7 < 0x11) {
      iVar4 = L->stacksize;
      iVar5 = iVar4 * 2;
      if (iVar4 < 1) {
        iVar5 = iVar4 + 1;
      }
      luaD_reallocstack(L,iVar5);
    }
    L->top = L->top + 1;
    goto LAB_0010adb8;
  }
  pcVar6 = strchr(what,0x4c);
  if (pcVar6 == (char *)0x0) {
    pTVar7 = (StkId)0x0;
    goto LAB_0010ae73;
  }
LAB_0010add2:
  if ((pGVar10->h).flags != '\0') goto LAB_0010add8;
  t = (GCObject *)luaH_new(L,0,0);
  if (0 < *(int *)((long)&((pGVar10->th).l_G)->tmudata + 4)) {
    pGVar2 = ((pGVar10->th).l_G)->rootgc;
    lVar11 = 0;
    do {
      pTVar8 = luaH_setnum(L,&t->h,*(int *)((long)pGVar2 + lVar11 * 4));
      (pTVar8->value).b = 1;
      pTVar8->tt = 1;
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)((long)&((pGVar10->th).l_G)->tmudata + 4));
  }
  pTVar7 = L->top;
  (pTVar7->value).gc = t;
  pTVar7->tt = 5;
  pTVar7 = L->top;
LAB_0010ae43:
  if ((long)L->stack_last - (long)pTVar7 < 0x11) {
    iVar4 = L->stacksize;
    iVar5 = iVar4 * 2;
    if (iVar4 < 1) {
      iVar5 = iVar4 + 1;
    }
    luaD_reallocstack(L,iVar5);
    pTVar7 = L->top;
  }
  pTVar7 = pTVar7 + 1;
  L->top = pTVar7;
LAB_0010ae73:
  return (int)pTVar7;
}

Assistant:

static int lua_getinfo(lua_State*L,const char*what,lua_Debug*ar){
int status;
Closure*f=NULL;
CallInfo*ci=NULL;
if(*what=='>'){
StkId func=L->top-1;
luai_apicheck(L,ttisfunction(func));
what++;
f=clvalue(func);
L->top--;
}
else if(ar->i_ci!=0){
ci=L->base_ci+ar->i_ci;
f=clvalue(ci->func);
}
status=auxgetinfo(L,what,ar,f,ci);
if(strchr(what,'f')){
if(f==NULL)setnilvalue(L->top);
else setclvalue(L,L->top,f);
incr_top(L);
}
if(strchr(what,'L'))
collectvalidlines(L,f);
return status;
}